

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O0

CURLcode ftp_readresp(curl_socket_t sockfd,pingpong *pp,int *ftpcode,size_t *size)

{
  int local_40;
  CURLcode local_3c;
  int code;
  CURLcode result;
  Curl_easy *data;
  connectdata *conn;
  size_t *size_local;
  int *ftpcode_local;
  pingpong *pp_local;
  curl_socket_t sockfd_local;
  
  data = (Curl_easy *)pp->conn;
  _code = data->next;
  local_3c = 0;
  conn = (connectdata *)size;
  size_local = (size_t *)ftpcode;
  ftpcode_local = (int *)pp;
  pp_local._0_4_ = sockfd;
  local_3c = Curl_pp_readresp(sockfd,pp,&local_40,size);
  (_code->info).httpcode = local_40;
  if (size_local != (size_t *)0x0) {
    *(int *)size_local = local_40;
  }
  pp_local._4_4_ = local_3c;
  if (local_40 == 0x1a5) {
    Curl_infof(_code,"We got a 421 - timeout!\n");
    _state((connectdata *)data,FTP_STOP);
    pp_local._4_4_ = CURLE_OPERATION_TIMEDOUT;
  }
  return pp_local._4_4_;
}

Assistant:

static CURLcode ftp_readresp(curl_socket_t sockfd,
                             struct pingpong *pp,
                             int *ftpcode, /* return the ftp-code if done */
                             size_t *size) /* size of the response */
{
  struct connectdata *conn = pp->conn;
  struct Curl_easy *data = conn->data;
#ifdef HAVE_GSSAPI
  char * const buf = data->state.buffer;
#endif
  CURLcode result = CURLE_OK;
  int code;

  result = Curl_pp_readresp(sockfd, pp, &code, size);

#if defined(HAVE_GSSAPI)
  /* handle the security-oriented responses 6xx ***/
  /* FIXME: some errorchecking perhaps... ***/
  switch(code) {
  case 631:
    code = Curl_sec_read_msg(conn, buf, PROT_SAFE);
    break;
  case 632:
    code = Curl_sec_read_msg(conn, buf, PROT_PRIVATE);
    break;
  case 633:
    code = Curl_sec_read_msg(conn, buf, PROT_CONFIDENTIAL);
    break;
  default:
    /* normal ftp stuff we pass through! */
    break;
  }
#endif

  /* store the latest code for later retrieval */
  data->info.httpcode = code;

  if(ftpcode)
    *ftpcode = code;

  if(421 == code) {
    /* 421 means "Service not available, closing control connection." and FTP
     * servers use it to signal that idle session timeout has been exceeded.
     * If we ignored the response, it could end up hanging in some cases.
     *
     * This response code can come at any point so having it treated
     * generically is a good idea.
     */
    infof(data, "We got a 421 - timeout!\n");
    state(conn, FTP_STOP);
    return CURLE_OPERATION_TIMEDOUT;
  }

  return result;
}